

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O2

void __thiscall
supermap::BST<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::add
          (BST<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,Key<2UL> *key,
          ByteArray<2UL> *value)

{
  mapped_type *this_00;
  
  this_00 = std::
            map<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_supermap::ByteArray<2UL>_>_>_>
            ::operator[](&this->map_,key);
  ByteArray<2UL>::operator=(this_00,value);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        map_[key] = std::move(value);
    }